

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar5;
  int iVar8;
  int *piVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Mat *pMVar14;
  Option *opt_00;
  Mat *kernel_tm_00;
  int iVar15;
  long lVar16;
  uint uVar17;
  float *pfVar18;
  void *pvVar19;
  ulong uVar20;
  float *pfVar21;
  uint uVar22;
  void *pvVar23;
  void *pvVar24;
  ulong uVar25;
  undefined8 *puVar26;
  ulong uVar27;
  undefined8 *puVar28;
  float *pfVar29;
  long lVar30;
  long lVar31;
  void *pvVar32;
  void *pvVar33;
  void *pvVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  float fVar43;
  void *local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  float *local_270;
  void *local_260;
  undefined1 local_258 [16];
  Mat local_248;
  long local_200;
  long local_1f8;
  void *local_1f0;
  ulong local_1e8;
  long local_1e0;
  long local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  int local_1c0;
  int local_1bc;
  Mat local_1b8;
  undefined1 local_168 [4];
  float afStack_164 [2];
  float fStack_15c;
  size_t local_158;
  int iStack_150;
  Allocator *local_148;
  int iStack_140;
  int iStack_13c;
  float afStack_138 [4];
  size_t local_128 [2];
  Mat *local_118;
  Option *local_110;
  Mat local_108;
  Mat *local_b8;
  Mat *local_b0;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  float afStack_98 [4];
  undefined1 local_88 [16];
  Option opt_b;
  
  iVar15 = bottom_blob->c;
  uVar3 = top_blob->w;
  uVar6 = top_blob->h;
  auVar36._4_4_ = uVar6;
  auVar36._0_4_ = uVar3;
  iVar8 = top_blob->c;
  piVar9 = bottom_blob->refcount;
  local_1b8.data = bottom_blob->data;
  local_1b8.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_1b8.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1b8.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_1b8.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_1b8.elempack = bottom_blob->elempack;
  local_1b8.allocator = bottom_blob->allocator;
  auVar37._0_4_ = bottom_blob->dims;
  auVar37._4_4_ = bottom_blob->w;
  auVar37._8_4_ = bottom_blob->h;
  auVar37._12_4_ = bottom_blob->d;
  local_1b8.cstep = bottom_blob->cstep;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
  }
  auVar40 = vpcmpeqd_avx(auVar37,auVar37);
  auVar36._8_8_ = 0;
  auVar36 = vpsubd_avx(auVar36,auVar40);
  auVar40 = vpsrld_avx(auVar36,0x1f);
  local_258 = vpaddd_avx(auVar36,auVar40);
  auVar40._8_4_ = 0xfffffffe;
  auVar40._0_8_ = 0xfffffffefffffffe;
  auVar40._12_4_ = 0xfffffffe;
  local_88 = vpand_avx(local_258,auVar40);
  local_1bc = local_88._4_4_;
  local_1c0 = local_88._0_4_;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  auVar42 = ZEXT1664(opt_b._32_16_);
  local_1b8.dims = auVar37._0_4_;
  local_1b8.w = auVar37._4_4_;
  local_1b8.h = auVar37._8_4_;
  local_1b8.d = auVar37._12_4_;
  local_1b8.c = iVar15;
  local_b8 = bias;
  copy_make_border(bottom_blob,&local_1b8,0,(local_1bc - bottom_blob->h) + 2,0,
                   (local_1c0 - bottom_blob->w) + 2,0,0.0,&opt_b);
  local_200 = CONCAT44(local_200._4_4_,iVar8);
  auVar37 = vpsrad_avx(local_258,1);
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_118 = top_blob;
  local_110 = opt;
  local_b0 = kernel_tm;
  Mat::create(&local_108,auVar37._4_4_ * auVar37._0_4_,0x10,iVar15,4,opt->workspace_allocator);
  kernel_tm_00 = local_b0;
  opt_00 = local_110;
  pMVar14 = local_118;
  auVar37 = auVar42._0_16_;
  if (0 < (long)local_1b8.c) {
    local_1e8 = (ulong)(uint)local_1b8.h;
    uVar17 = (local_1b8.h - ((int)(local_1b8.h - 2U) >> 0x1f)) + -2 >> 1;
    uVar22 = (local_1b8.w - (local_1b8.w + -2 >> 0x1f)) + -2 >> 1;
    iVar15 = uVar22 * uVar17;
    uVar27 = 1;
    if (1 < (int)uVar22) {
      uVar27 = (ulong)uVar22;
    }
    local_1d0 = 1;
    if (1 < (int)uVar17) {
      local_1d0 = (ulong)uVar17;
    }
    local_270 = (float *)((long)local_1b8.data + 0xc);
    local_1f8 = local_1b8.cstep * CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
    local_1c8 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) *
                (long)local_1b8.w * 2;
    local_1f0 = (void *)(CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize) *
                        local_108.cstep);
    local_1d8 = (long)(int)uVar22 * 4;
    local_280 = (void *)((long)local_108.data + (long)iVar15 * 4);
    local_288 = (void *)((long)local_108.data + (long)(iVar15 * 3) * 4);
    local_278 = local_108.data;
    local_290 = (void *)((long)local_108.data + (long)(iVar15 * 2) * 4);
    lVar16 = 0;
    do {
      local_1e0 = lVar16;
      if (3 < local_1b8.h) {
        local_258._0_8_ = local_290;
        local_260 = local_288;
        uVar25 = 0;
        pfVar18 = local_270;
        pvVar19 = local_280;
        pvVar23 = local_278;
        do {
          if (3 < local_1b8.w) {
            uVar20 = 0;
            lVar16 = local_258._0_8_;
            pvVar24 = pvVar23;
            pfVar29 = pfVar18;
            pvVar32 = pvVar19;
            pvVar34 = local_260;
            do {
              lVar30 = -0x10;
              pfVar21 = pfVar29;
              do {
                fVar35 = pfVar21[-2];
                fVar1 = pfVar21[-1];
                fVar43 = *pfVar21;
                *(float *)((long)&local_158 + lVar30) = pfVar21[-3] - fVar1;
                *(float *)((long)&local_148 + lVar30) = fVar1 + fVar35;
                *(float *)((long)afStack_138 + lVar30) = fVar1 - fVar35;
                *(float *)((long)local_128 + lVar30) = fVar43 - fVar35;
                pfVar21 = pfVar21 + local_1b8.w;
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0);
              lVar31 = 0;
              lVar30 = 0;
              do {
                fVar35 = *(float *)(local_168 + lVar30 + 4);
                fVar1 = *(float *)((long)afStack_164 + lVar30 + 4);
                fVar43 = *(float *)((long)afStack_164 + lVar30 + 8) - fVar35;
                auVar42 = ZEXT464((uint)fVar43);
                *(float *)((long)pvVar24 + lVar31) = *(float *)(local_168 + lVar30) - fVar1;
                *(float *)((long)pvVar32 + lVar31) = fVar1 + fVar35;
                *(float *)(lVar16 + lVar31) = fVar1 - fVar35;
                *(float *)((long)pvVar34 + lVar31) = fVar43;
                lVar30 = lVar30 + 0x10;
                lVar31 = lVar31 + (long)(iVar15 * 4) * 4;
              } while (lVar30 != 0x40);
              uVar20 = uVar20 + 1;
              pfVar29 = pfVar29 + 2;
              pvVar24 = (void *)((long)pvVar24 + 4);
              pvVar32 = (void *)((long)pvVar32 + 4);
              pvVar34 = (void *)((long)pvVar34 + 4);
              lVar16 = lVar16 + 4;
            } while (uVar20 != uVar27);
          }
          uVar25 = uVar25 + 1;
          pfVar18 = (float *)((long)pfVar18 + local_1c8);
          pvVar23 = (void *)((long)pvVar23 + local_1d8);
          pvVar19 = (void *)((long)pvVar19 + local_1d8);
          local_260 = (void *)((long)local_260 + local_1d8);
          local_258._0_8_ = local_258._0_8_ + local_1d8;
        } while (uVar25 != local_1d0);
      }
      auVar37 = auVar42._0_16_;
      local_270 = (float *)((long)local_270 + local_1f8);
      local_278 = (void *)((long)local_278 + (long)local_1f0);
      local_280 = (void *)((long)local_280 + (long)local_1f0);
      local_288 = (void *)((long)local_288 + (long)local_1f0);
      local_290 = (void *)((long)local_290 + (long)local_1f0);
      lVar16 = local_1e0 + 1;
    } while (local_1e0 + 1 != (long)local_1b8.c);
  }
  piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  iVar15 = (int)local_200;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_128[0] = 0;
  _local_168 = (void *)0x0;
  afStack_164[1] = 0.0;
  fStack_15c = 0.0;
  local_158 = 0;
  iStack_150 = 0;
  local_148 = (Allocator *)0x0;
  iStack_140 = 0;
  iStack_13c = 0;
  afStack_138[0] = 0.0;
  afStack_138[1] = 0.0;
  afStack_138[2] = 0.0;
  convolution_winograd_dot_sse(&local_108,iVar15,kernel_tm_00,(Mat *)local_168,opt_00);
  local_248.cstep = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  uVar4 = pMVar14->w;
  uVar7 = pMVar14->h;
  auVar38._4_4_ = uVar7;
  auVar38._0_4_ = uVar4;
  auVar38._8_8_ = 0;
  auVar36 = vpcmpeqd_avx(auVar38,local_88);
  auVar36 = vpmovsxdq_avx(auVar36);
  auVar37 = vpcmpeqd_avx(auVar37,auVar37);
  if (((auVar37 & ~auVar36) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar37 & ~auVar36,0xf)) {
    if (&local_248 != pMVar14) {
      piVar9 = pMVar14->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      local_248.data = pMVar14->data;
      local_248.refcount._0_4_ = SUB84(pMVar14->refcount,0);
      local_248.refcount._4_4_ = (undefined4)((ulong)pMVar14->refcount >> 0x20);
      local_248.elemsize._0_4_ = (undefined4)pMVar14->elemsize;
      local_248.elemsize._4_4_ = (undefined4)(pMVar14->elemsize >> 0x20);
      local_248.elempack = pMVar14->elempack;
      local_248.allocator = pMVar14->allocator;
      uVar10 = pMVar14->dims;
      uVar11 = pMVar14->w;
      uVar12 = pMVar14->h;
      uVar13 = pMVar14->d;
      local_248.c = pMVar14->c;
      local_248.cstep = pMVar14->cstep;
      local_248.dims = uVar10;
      local_248.w = uVar11;
      local_248.h = uVar12;
      local_248.d = uVar13;
    }
  }
  else {
    Mat::create(&local_248,local_1c0,local_1bc,iVar15,4,opt_00->workspace_allocator);
  }
  uVar27 = (ulong)local_248.w;
  local_1e8 = (ulong)local_248.c;
  if (0 < (long)local_1e8) {
    local_1f0 = local_b8->data;
    local_1c8 = (ulong)(uint)(local_248.h / 2);
    uVar17 = (int)(((uint)(uVar27 >> 0x1f) & 1) + local_248.w) >> 1;
    iVar15 = (local_248.h / 2) * uVar17;
    local_278 = local_248.data;
    local_1f8 = local_158 * local_128[0];
    local_1d8 = (ulong)uVar17 * 4;
    local_280 = (void *)((long)_local_168 + (long)iVar15 * 4);
    local_288 = (void *)((long)_local_168 + (long)(iVar15 * 2) * 4);
    local_270 = (float *)_local_168;
    local_290 = (void *)((long)_local_168 + (long)(iVar15 * 3) * 4);
    local_200 = local_248.cstep * CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
    local_1d0 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) * uVar27 * 2;
    lVar16 = 0;
    do {
      local_1e0 = lVar16;
      if (local_1f0 == (void *)0x0) {
        fVar35 = 0.0;
      }
      else {
        fVar35 = *(float *)((long)local_1f0 + local_1e0 * 4);
      }
      if (1 < local_248.h) {
        local_258._0_8_ = local_278;
        local_260 = local_290;
        uVar25 = 0;
        pvVar19 = local_288;
        pvVar23 = local_280;
        pfVar18 = local_270;
        do {
          if (1 < local_248.w) {
            uVar20 = 0;
            pvVar24 = pvVar19;
            pvVar32 = pvVar23;
            pvVar34 = pfVar18;
            puVar28 = (undefined8 *)local_258._0_8_;
            pvVar33 = local_260;
            do {
              lVar30 = -0x10;
              lVar16 = 0;
              do {
                fVar1 = *(float *)((long)pvVar32 + lVar16 * 4);
                fVar43 = *(float *)((long)pvVar24 + lVar16 * 4);
                fVar2 = *(float *)((long)pvVar33 + lVar16 * 4);
                *(float *)((long)afStack_98 + lVar30) =
                     fVar1 + *(float *)((long)pvVar34 + lVar16 * 4) + fVar43;
                *(float *)(local_88 + lVar30) = (fVar1 - fVar43) + fVar2;
                lVar16 = lVar16 + iVar15 * 4;
                lVar30 = lVar30 + 4;
              } while (lVar30 != 0);
              lVar16 = 0;
              puVar26 = puVar28;
              do {
                fVar1 = fVar35 + *(float *)((long)afStack_a8 + lVar16 + 4);
                fVar43 = (float)*(undefined8 *)((long)&uStack_a0 + lVar16);
                auVar37 = vinsertps_avx(ZEXT416((uint)(fVar1 + *(float *)((long)afStack_a8 + lVar16)
                                                      )),ZEXT416((uint)(fVar1 - fVar43)),0x10);
                auVar41._0_4_ = auVar37._0_4_ + fVar43;
                auVar41._4_4_ =
                     auVar37._4_4_ +
                     (float)((ulong)*(undefined8 *)((long)&uStack_a0 + lVar16) >> 0x20);
                auVar41._8_4_ = auVar37._8_4_ + 0.0;
                auVar41._12_4_ = auVar37._12_4_ + 0.0;
                uVar5 = vmovlps_avx(auVar41);
                *puVar26 = uVar5;
                lVar16 = lVar16 + 0x10;
                puVar26 = (undefined8 *)((long)puVar26 + uVar27 * 4);
              } while (lVar16 == 0x10);
              uVar20 = uVar20 + 1;
              pvVar34 = (void *)((long)pvVar34 + 4);
              pvVar32 = (void *)((long)pvVar32 + 4);
              pvVar24 = (void *)((long)pvVar24 + 4);
              pvVar33 = (void *)((long)pvVar33 + 4);
              puVar28 = puVar28 + 1;
            } while (uVar20 != uVar17);
          }
          uVar25 = uVar25 + 1;
          pfVar18 = (float *)((long)pfVar18 + local_1d8);
          pvVar23 = (void *)((long)pvVar23 + local_1d8);
          pvVar19 = (void *)((long)pvVar19 + local_1d8);
          local_260 = (void *)((long)local_260 + local_1d8);
          local_258._0_8_ = local_258._0_8_ + local_1d0;
        } while (uVar25 != local_1c8);
      }
      local_270 = (float *)((long)local_270 + local_1f8);
      local_280 = (void *)((long)local_280 + local_1f8);
      local_288 = (void *)((long)local_288 + local_1f8);
      local_290 = (void *)((long)local_290 + local_1f8);
      local_278 = (void *)((long)local_278 + local_200);
      lVar16 = local_1e0 + 1;
    } while (local_1e0 + 1 != local_1e8);
  }
  copy_cut_border(&local_248,local_118,0,local_248.h - local_118->h,0,local_248.w - local_118->w,
                  local_110);
  piVar9 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_248.cstep = 0;
  auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  piVar9 = (int *)CONCAT44(fStack_15c,afStack_164[1]);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_148 == (Allocator *)0x0) {
        if (_local_168 != (void *)0x0) {
          free(_local_168);
          auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*local_148->_vptr_Allocator[3])();
        auVar39 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_128[0] = 0;
  _local_168 = (void *)0x0;
  afStack_164[1] = auVar39._4_4_;
  fStack_15c = 0.0;
  local_158 = auVar39._0_8_;
  iStack_150 = auVar39._8_4_;
  iStack_13c = 0;
  afStack_138._0_8_ = auVar39._4_8_;
  afStack_138[2] = 0.0;
  piVar9 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  iStack_140 = (int)fStack_15c;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  piVar9 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}